

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int resolveSelectStep(Walker *pWalker,Select *p)

{
  Parse *pParse;
  anon_union_8_17_dfc45e9e_for_u pOuterNC;
  sqlite3 *psVar1;
  Select *pSVar2;
  Select *pSVar3;
  char *pcVar4;
  ExprList *pOrderBy;
  uint uVar5;
  SrcList *pSVar6;
  int iVar7;
  long lVar8;
  Window *pWVar9;
  long lVar10;
  char *pcVar11;
  ExprList_item *pEVar12;
  ulong uVar13;
  NameContext sNC;
  NameContext local_a8;
  Select *local_70;
  ulong local_68;
  Walker local_60;
  
  iVar7 = 1;
  if ((p->selFlags & 4) == 0) {
    pParse = pWalker->pParse;
    pOuterNC = (anon_union_8_17_dfc45e9e_for_u)(pWalker->u).pNC;
    if ((p->selFlags & 0x40) == 0) {
      sqlite3SelectPrep(pParse,p,pOuterNC.pNC);
      iVar7 = 2 - (uint)(pParse->nErr == 0);
    }
    else {
      psVar1 = pParse->db;
      pSVar2 = p->pPrior;
      uVar13 = 0;
      local_70 = p;
      do {
        *(byte *)&p->selFlags = (byte)p->selFlags | 4;
        local_a8.pNext = (NameContext *)0x0;
        local_a8.nRef = 0;
        local_a8.nNcErr = 0;
        local_a8.pSrcList = (SrcList *)0x0;
        local_a8.uNC.pEList = (ExprList *)0x0;
        local_a8.ncFlags = 0;
        local_a8._44_4_ = 0;
        local_a8.pParse = pParse;
        local_a8.pWinSelect = p;
        iVar7 = sqlite3ResolveExprNames(&local_a8,p->pLimit);
        if (iVar7 != 0) {
          return 2;
        }
        pSVar6 = p->pSrc;
        if ((p->selFlags & 0x10000) != 0) {
          (pSVar6->a[0].pSelect)->pOrderBy = p->pOrderBy;
          p->pOrderBy = (ExprList *)0x0;
        }
        local_68 = uVar13;
        if (0 < pSVar6->nSrc) {
          lVar10 = 0x45;
          lVar8 = 0;
          do {
            pSVar3 = *(Select **)((long)pSVar6->a + lVar10 + -0x1d);
            if ((pSVar3 != (Select *)0x0) && ((pSVar3->selFlags & 4) == 0)) {
              if (pOuterNC.pNC == (NameContext *)0x0) {
                iVar7 = 0;
              }
              else {
                iVar7 = (pOuterNC.pNC)->nRef;
              }
              pcVar11 = pParse->zAuthContext;
              pcVar4 = *(char **)((long)pSVar6->a + lVar10 + -0x35);
              if (pcVar4 != (char *)0x0) {
                pParse->zAuthContext = pcVar4;
              }
              local_60.xExprCallback = resolveExprStep;
              local_60.xSelectCallback = resolveSelectStep;
              local_60.xSelectCallback2 = (_func_void_Walker_ptr_Select_ptr *)0x0;
              local_60.pParse = pParse;
              local_60.u = pOuterNC;
              sqlite3WalkSelect(&local_60,pSVar3);
              pParse->zAuthContext = pcVar11;
              if (pParse->nErr != 0) {
                return 2;
              }
              if (pOuterNC.pNC != (NameContext *)0x0) {
                *(ushort *)((long)pSVar6->a + lVar10 + -8) =
                     (*(ushort *)((long)pSVar6->a + lVar10 + -8) & 0xfff7) +
                     (ushort)(iVar7 < (pOuterNC.pNC)->nRef) * 8;
              }
            }
            lVar8 = lVar8 + 1;
            pSVar6 = p->pSrc;
            lVar10 = lVar10 + 0x68;
          } while (lVar8 < pSVar6->nSrc);
        }
        local_a8.ncFlags = 0x4001;
        local_a8.pSrcList = pSVar6;
        local_a8.pNext = (NameContext *)pOuterNC;
        iVar7 = sqlite3ResolveExprListNames(&local_a8,p->pEList);
        if (iVar7 != 0) {
          return 2;
        }
        pOrderBy = p->pGroupBy;
        if (pOrderBy == (ExprList *)0x0 && (local_a8.ncFlags & 0x10U) == 0) {
          uVar5 = local_a8.ncFlags & 0xffffbfee;
        }
        else {
          uVar5 = local_a8.ncFlags & 0xffffbfff;
          p->selFlags = local_a8.ncFlags & 0x8001000U | p->selFlags | 8;
        }
        local_a8.uNC = (anon_union_8_4_82a96254_for_uNC)p->pEList;
        local_a8._40_8_ = CONCAT44(local_a8._44_4_,uVar5) | 0x80;
        if (p->pHaving != (Expr *)0x0) {
          if ((p->selFlags & 8) == 0) {
            pcVar11 = "HAVING clause on a non-aggregate query";
LAB_0018f92f:
            sqlite3ErrorMsg(pParse,pcVar11);
            return 2;
          }
          iVar7 = sqlite3ResolveExprNames(&local_a8,p->pHaving);
          if (iVar7 != 0) {
            return 2;
          }
        }
        iVar7 = sqlite3ResolveExprNames(&local_a8,p->pWhere);
        if (iVar7 != 0) {
          return 2;
        }
        pSVar6 = p->pSrc;
        iVar7 = pSVar6->nSrc;
        if (0 < iVar7) {
          lVar8 = 0x60;
          lVar10 = 0;
          do {
            if ((*(byte *)((long)pSVar6->a + lVar8 + -0x23) & 4) != 0) {
              iVar7 = sqlite3ResolveExprListNames
                                (&local_a8,*(ExprList **)((long)pSVar6->a + lVar8 + -8));
              if (iVar7 != 0) {
                return 2;
              }
              pSVar6 = p->pSrc;
              iVar7 = pSVar6->nSrc;
            }
            lVar10 = lVar10 + 1;
            lVar8 = lVar8 + 0x68;
          } while (lVar10 < iVar7);
        }
        uVar13 = local_68;
        if (1 < pParse->eParseMode) {
          for (pWVar9 = p->pWinDefn; pWVar9 != (Window *)0x0; pWVar9 = pWVar9->pNextWin) {
            iVar7 = sqlite3ResolveExprListNames(&local_a8,pWVar9->pOrderBy);
            if (iVar7 != 0) {
              return 2;
            }
            iVar7 = sqlite3ResolveExprListNames(&local_a8,pWVar9->pPartition);
            if (iVar7 != 0) {
              return 2;
            }
          }
        }
        local_a8.pNext = (NameContext *)0x0;
        local_a8._40_8_ = local_a8._40_8_ | 0x4001;
        if ((p->selFlags & 0x10000) != 0) {
          pSVar3 = p->pSrc->a[0].pSelect;
          p->pOrderBy = pSVar3->pOrderBy;
          pSVar3->pOrderBy = (ExprList *)0x0;
        }
        if (((p->pOrderBy != (ExprList *)0x0) && (pSVar2 == (Select *)0x0 || (int)uVar13 != 0)) &&
           (iVar7 = resolveOrderGroupBy(&local_a8,p,p->pOrderBy,"ORDER"), iVar7 != 0)) {
          return 2;
        }
        if (psVar1->mallocFailed != '\0') {
          return 2;
        }
        local_a8._40_8_ = local_a8._40_8_ & 0xffffffffffffbfff;
        if (pOrderBy != (ExprList *)0x0) {
          iVar7 = resolveOrderGroupBy(&local_a8,p,pOrderBy,"GROUP");
          if (iVar7 != 0) {
            return 2;
          }
          if (psVar1->mallocFailed != '\0') {
            return 2;
          }
          iVar7 = pOrderBy->nExpr;
          if (0 < iVar7) {
            pEVar12 = pOrderBy->a;
            do {
              if ((pEVar12->pExpr->flags & 0x10) != 0) {
                pcVar11 = "aggregate functions are not allowed in the GROUP BY clause";
                goto LAB_0018f92f;
              }
              pEVar12 = pEVar12 + 1;
              iVar7 = iVar7 + -1;
            } while (iVar7 != 0);
          }
        }
        pSVar3 = p->pNext;
        if ((pSVar3 != (Select *)0x0) && (p->pEList->nExpr != pSVar3->pEList->nExpr)) {
          sqlite3SelectWrongNumTermsError(pParse,pSVar3);
          return 2;
        }
        p = p->pPrior;
        uVar13 = (ulong)((int)uVar13 + 1);
      } while (p != (Select *)0x0);
      if ((pSVar2 != (Select *)0x0) && (iVar7 = resolveCompoundOrderBy(pParse,local_70), iVar7 != 0)
         ) {
        return 2;
      }
      iVar7 = 1;
    }
  }
  return iVar7;
}

Assistant:

static int resolveSelectStep(Walker *pWalker, Select *p){
  NameContext *pOuterNC;  /* Context that contains this SELECT */
  NameContext sNC;        /* Name context of this SELECT */
  int isCompound;         /* True if p is a compound select */
  int nCompound;          /* Number of compound terms processed so far */
  Parse *pParse;          /* Parsing context */
  int i;                  /* Loop counter */
  ExprList *pGroupBy;     /* The GROUP BY clause */
  Select *pLeftmost;      /* Left-most of SELECT of a compound */
  sqlite3 *db;            /* Database connection */


  assert( p!=0 );
  if( p->selFlags & SF_Resolved ){
    return WRC_Prune;
  }
  pOuterNC = pWalker->u.pNC;
  pParse = pWalker->pParse;
  db = pParse->db;

  /* Normally sqlite3SelectExpand() will be called first and will have
  ** already expanded this SELECT.  However, if this is a subquery within
  ** an expression, sqlite3ResolveExprNames() will be called without a
  ** prior call to sqlite3SelectExpand().  When that happens, let
  ** sqlite3SelectPrep() do all of the processing for this SELECT.
  ** sqlite3SelectPrep() will invoke both sqlite3SelectExpand() and
  ** this routine in the correct order.
  */
  if( (p->selFlags & SF_Expanded)==0 ){
    sqlite3SelectPrep(pParse, p, pOuterNC);
    return pParse->nErr ? WRC_Abort : WRC_Prune;
  }

  isCompound = p->pPrior!=0;
  nCompound = 0;
  pLeftmost = p;
  while( p ){
    assert( (p->selFlags & SF_Expanded)!=0 );
    assert( (p->selFlags & SF_Resolved)==0 );
    assert( db->suppressErr==0 ); /* SF_Resolved not set if errors suppressed */
    p->selFlags |= SF_Resolved;


    /* Resolve the expressions in the LIMIT and OFFSET clauses. These
    ** are not allowed to refer to any names, so pass an empty NameContext.
    */
    memset(&sNC, 0, sizeof(sNC));
    sNC.pParse = pParse;
    sNC.pWinSelect = p;
    if( sqlite3ResolveExprNames(&sNC, p->pLimit) ){
      return WRC_Abort;
    }

    /* If the SF_Converted flags is set, then this Select object was
    ** was created by the convertCompoundSelectToSubquery() function.
    ** In this case the ORDER BY clause (p->pOrderBy) should be resolved
    ** as if it were part of the sub-query, not the parent. This block
    ** moves the pOrderBy down to the sub-query. It will be moved back
    ** after the names have been resolved.  */
    if( p->selFlags & SF_Converted ){
      Select *pSub = p->pSrc->a[0].pSelect;
      assert( p->pSrc->nSrc==1 && p->pOrderBy );
      assert( pSub->pPrior && pSub->pOrderBy==0 );
      pSub->pOrderBy = p->pOrderBy;
      p->pOrderBy = 0;
    }

    /* Recursively resolve names in all subqueries in the FROM clause
    */
    for(i=0; i<p->pSrc->nSrc; i++){
      SrcItem *pItem = &p->pSrc->a[i];
      if( pItem->pSelect && (pItem->pSelect->selFlags & SF_Resolved)==0 ){
        int nRef = pOuterNC ? pOuterNC->nRef : 0;
        const char *zSavedContext = pParse->zAuthContext;

        if( pItem->zName ) pParse->zAuthContext = pItem->zName;
        sqlite3ResolveSelectNames(pParse, pItem->pSelect, pOuterNC);
        pParse->zAuthContext = zSavedContext;
        if( pParse->nErr ) return WRC_Abort;
        assert( db->mallocFailed==0 );

        /* If the number of references to the outer context changed when
        ** expressions in the sub-select were resolved, the sub-select
        ** is correlated. It is not required to check the refcount on any
        ** but the innermost outer context object, as lookupName() increments
        ** the refcount on all contexts between the current one and the
        ** context containing the column when it resolves a name. */
        if( pOuterNC ){
          assert( pItem->fg.isCorrelated==0 && pOuterNC->nRef>=nRef );
          pItem->fg.isCorrelated = (pOuterNC->nRef>nRef);
        }
      }
    }

    /* Set up the local name-context to pass to sqlite3ResolveExprNames() to
    ** resolve the result-set expression list.
    */
    sNC.ncFlags = NC_AllowAgg|NC_AllowWin;
    sNC.pSrcList = p->pSrc;
    sNC.pNext = pOuterNC;

    /* Resolve names in the result set. */
    if( sqlite3ResolveExprListNames(&sNC, p->pEList) ) return WRC_Abort;
    sNC.ncFlags &= ~NC_AllowWin;

    /* If there are no aggregate functions in the result-set, and no GROUP BY
    ** expression, do not allow aggregates in any of the other expressions.
    */
    assert( (p->selFlags & SF_Aggregate)==0 );
    pGroupBy = p->pGroupBy;
    if( pGroupBy || (sNC.ncFlags & NC_HasAgg)!=0 ){
      assert( NC_MinMaxAgg==SF_MinMaxAgg );
      assert( NC_OrderAgg==SF_OrderByReqd );
      p->selFlags |= SF_Aggregate | (sNC.ncFlags&(NC_MinMaxAgg|NC_OrderAgg));
    }else{
      sNC.ncFlags &= ~NC_AllowAgg;
    }

    /* Add the output column list to the name-context before parsing the
    ** other expressions in the SELECT statement. This is so that
    ** expressions in the WHERE clause (etc.) can refer to expressions by
    ** aliases in the result set.
    **
    ** Minor point: If this is the case, then the expression will be
    ** re-evaluated for each reference to it.
    */
    assert( (sNC.ncFlags & (NC_UAggInfo|NC_UUpsert|NC_UBaseReg))==0 );
    sNC.uNC.pEList = p->pEList;
    sNC.ncFlags |= NC_UEList;
    if( p->pHaving ){
      if( (p->selFlags & SF_Aggregate)==0 ){
        sqlite3ErrorMsg(pParse, "HAVING clause on a non-aggregate query");
        return WRC_Abort;
      }
      if( sqlite3ResolveExprNames(&sNC, p->pHaving) ) return WRC_Abort;
    }
    if( sqlite3ResolveExprNames(&sNC, p->pWhere) ) return WRC_Abort;

    /* Resolve names in table-valued-function arguments */
    for(i=0; i<p->pSrc->nSrc; i++){
      SrcItem *pItem = &p->pSrc->a[i];
      if( pItem->fg.isTabFunc
       && sqlite3ResolveExprListNames(&sNC, pItem->u1.pFuncArg)
      ){
        return WRC_Abort;
      }
    }

#ifndef SQLITE_OMIT_WINDOWFUNC
    if( IN_RENAME_OBJECT ){
      Window *pWin;
      for(pWin=p->pWinDefn; pWin; pWin=pWin->pNextWin){
        if( sqlite3ResolveExprListNames(&sNC, pWin->pOrderBy)
         || sqlite3ResolveExprListNames(&sNC, pWin->pPartition)
        ){
          return WRC_Abort;
        }
      }
    }
#endif

    /* The ORDER BY and GROUP BY clauses may not refer to terms in
    ** outer queries
    */
    sNC.pNext = 0;
    sNC.ncFlags |= NC_AllowAgg|NC_AllowWin;

    /* If this is a converted compound query, move the ORDER BY clause from
    ** the sub-query back to the parent query. At this point each term
    ** within the ORDER BY clause has been transformed to an integer value.
    ** These integers will be replaced by copies of the corresponding result
    ** set expressions by the call to resolveOrderGroupBy() below.  */
    if( p->selFlags & SF_Converted ){
      Select *pSub = p->pSrc->a[0].pSelect;
      p->pOrderBy = pSub->pOrderBy;
      pSub->pOrderBy = 0;
    }

    /* Process the ORDER BY clause for singleton SELECT statements.
    ** The ORDER BY clause for compounds SELECT statements is handled
    ** below, after all of the result-sets for all of the elements of
    ** the compound have been resolved.
    **
    ** If there is an ORDER BY clause on a term of a compound-select other
    ** than the right-most term, then that is a syntax error.  But the error
    ** is not detected until much later, and so we need to go ahead and
    ** resolve those symbols on the incorrect ORDER BY for consistency.
    */
    if( p->pOrderBy!=0
     && isCompound<=nCompound  /* Defer right-most ORDER BY of a compound */
     && resolveOrderGroupBy(&sNC, p, p->pOrderBy, "ORDER")
    ){
      return WRC_Abort;
    }
    if( db->mallocFailed ){
      return WRC_Abort;
    }
    sNC.ncFlags &= ~NC_AllowWin;

    /* Resolve the GROUP BY clause.  At the same time, make sure
    ** the GROUP BY clause does not contain aggregate functions.
    */
    if( pGroupBy ){
      struct ExprList_item *pItem;

      if( resolveOrderGroupBy(&sNC, p, pGroupBy, "GROUP") || db->mallocFailed ){
        return WRC_Abort;
      }
      for(i=0, pItem=pGroupBy->a; i<pGroupBy->nExpr; i++, pItem++){
        if( ExprHasProperty(pItem->pExpr, EP_Agg) ){
          sqlite3ErrorMsg(pParse, "aggregate functions are not allowed in "
              "the GROUP BY clause");
          return WRC_Abort;
        }
      }
    }

    /* If this is part of a compound SELECT, check that it has the right
    ** number of expressions in the select list. */
    if( p->pNext && p->pEList->nExpr!=p->pNext->pEList->nExpr ){
      sqlite3SelectWrongNumTermsError(pParse, p->pNext);
      return WRC_Abort;
    }

    /* Advance to the next term of the compound
    */
    p = p->pPrior;
    nCompound++;
  }

  /* Resolve the ORDER BY on a compound SELECT after all terms of
  ** the compound have been resolved.
  */
  if( isCompound && resolveCompoundOrderBy(pParse, pLeftmost) ){
    return WRC_Abort;
  }

  return WRC_Prune;
}